

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

void wwSetBit(word *a,size_t pos,bool_t val)

{
  a[pos >> 6] = 1L << ((byte)pos & 0x3f) & (-(long)val ^ a[pos >> 6]) ^ a[pos >> 6];
  return;
}

Assistant:

void wwSetBit(word a[], size_t pos, register bool_t val)
{
	register word f;
	ASSERT(wwIsValid(a, W_OF_B(pos + 1)));
	ASSERT(val == TRUE || val == FALSE);
	f = WORD_0 - (word)val;
	a[pos / B_PER_W] ^= (f ^ a[pos / B_PER_W]) & WORD_BIT_POS(pos % B_PER_W);
	f = 0;
}